

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O1

void __thiscall
TPZCreateApproximationSpace::SetAllCreateFunctionsContinuous(TPZCreateApproximationSpace *this)

{
  _func_TPZCompEl_ptr__Any_data_ptr_TPZGeoEl_ptr_ptr_TPZCompMesh_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  _Any_data __tmp;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  H1Family local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  this->fStyle = EContinuous;
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[0].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[0].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[0].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[0].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[0].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[0].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[0].super__Function_base._M_manager;
  this->fp[0].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:404:18)>
       ::_M_manager;
  p_Stack_20 = this->fp[0]._M_invoker;
  this->fp[0]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:404:18)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[1].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[1].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[1].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[1].super__Function_base._M_manager;
  this->fp[1].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:405:17)>
       ::_M_manager;
  p_Stack_20 = this->fp[1]._M_invoker;
  this->fp[1]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:405:17)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[3].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[3].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[3].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[3].super__Function_base._M_manager;
  this->fp[3].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:406:26)>
       ::_M_manager;
  p_Stack_20 = this->fp[3]._M_invoker;
  this->fp[3]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:406:26)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[2].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[2].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[2].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[2].super__Function_base._M_manager;
  this->fp[2].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:407:21)>
       ::_M_manager;
  p_Stack_20 = this->fp[2]._M_invoker;
  this->fp[2]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:407:21)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[4].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[4].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[4].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[4].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[4].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[4].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[4].super__Function_base._M_manager;
  this->fp[4].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:408:22)>
       ::_M_manager;
  p_Stack_20 = this->fp[4]._M_invoker;
  this->fp[4]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:408:22)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[5].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[5].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[5].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[5].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[5].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[5].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[5].super__Function_base._M_manager;
  this->fp[5].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:409:21)>
       ::_M_manager;
  p_Stack_20 = this->fp[5]._M_invoker;
  this->fp[5]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:409:21)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[6].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[6].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[6].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[6].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[6].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[6].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[6].super__Function_base._M_manager;
  this->fp[6].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:410:19)>
       ::_M_manager;
  p_Stack_20 = this->fp[6]._M_invoker;
  this->fp[6]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:410:19)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_18 = this->fh1fam;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&this->fp[7].super__Function_base._M_functor
  ;
  local_38._8_8_ = *(undefined8 *)((long)&this->fp[7].super__Function_base._M_functor + 8);
  *(H1Family *)&this->fp[7].super__Function_base._M_functor = local_18;
  *(undefined4 *)((long)&this->fp[7].super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&this->fp[7].super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&this->fp[7].super__Function_base._M_functor + 0xc) = 0;
  local_28 = this->fp[7].super__Function_base._M_manager;
  this->fp[7].super__Function_base._M_manager =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:411:17)>
       ::_M_manager;
  p_Stack_20 = this->fp[7]._M_invoker;
  this->fp[7]._M_invoker =
       std::
       _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:411:17)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void TPZCreateApproximationSpace::SetAllCreateFunctionsContinuous(){
    fStyle = EContinuous;
    const H1Family &h1fam = this->fh1fam;
    fp[EPoint] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreatePointEl(gel,mesh,h1fam);};
    fp[EOned] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateLinearEl(gel,mesh,h1fam);};
    fp[EQuadrilateral] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateQuadEl(gel,mesh,h1fam);};
    fp[ETriangle] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateTriangleEl(gel,mesh,h1fam);};
    fp[ETetraedro] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateTetraEl(gel,mesh,h1fam);};
    fp[EPiramide] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreatePyramEl(gel,mesh,h1fam);};
    fp[EPrisma] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreatePrismEl(gel,mesh,h1fam);};
    fp[ECube] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateCubeEl(gel,mesh,h1fam);};
    
    /*
     pzgeom::TPZGeoPoint::fp =  CreatePointEl;
     pzgeom::TPZGeoLinear::fp =  CreateLinearEl;
     pzgeom::TPZGeoQuad::fp = CreateQuadEl;
     pzgeom::TPZGeoTriangle::fp =  CreateTriangleEl;
     pzgeom::TPZGeoPrism::fp = CreatePrismEl;
     pzgeom::TPZGeoTetrahedra::fp = CreateTetraEl;
     pzgeom::TPZGeoPyramid::fp = CreatePyramEl;
     pzgeom::TPZGeoCube::fp = CreateCubeEl;
     */
	
}